

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

string * __thiscall
wabt::(anonymous_namespace)::CWriter::MangleTagTypes_abi_cxx11_
          (string *__return_storage_ptr__,CWriter *this,TypeVector *types)

{
  CWriter *this_00;
  bool bVar1;
  char cVar2;
  size_type sVar3;
  reference pTVar4;
  Type type;
  const_iterator __end2;
  const_iterator __begin2;
  TypeVector *__range2;
  CWriter *local_18;
  TypeVector *types_local;
  string *result;
  
  local_18 = this;
  types_local = (TypeVector *)__return_storage_ptr__;
  sVar3 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size
                    ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)this);
  if (sVar3 < 2) {
    __assert_fail("types.size() >= 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/c-writer.cc"
                  ,0x22e,
                  "static std::string wabt::(anonymous namespace)::CWriter::MangleTagTypes(const TypeVector &)"
                 );
  }
  __range2._7_1_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"wasm_tag_",(allocator<char> *)((long)&__range2 + 6));
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range2 + 6));
  this_00 = local_18;
  __end2 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::begin
                     ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)local_18);
  type = (Type)std::vector<wabt::Type,_std::allocator<wabt::Type>_>::end
                         ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)this_00);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_wabt::Type_*,_std::vector<wabt::Type,_std::allocator<wabt::Type>_>_>
                                     *)&type), bVar1) {
    pTVar4 = __gnu_cxx::
             __normal_iterator<const_wabt::Type_*,_std::vector<wabt::Type,_std::allocator<wabt::Type>_>_>
             ::operator*(&__end2);
    cVar2 = anon_unknown_0::CWriter::MangleType(*pTVar4);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,cVar2);
    __gnu_cxx::
    __normal_iterator<const_wabt::Type_*,_std::vector<wabt::Type,_std::allocator<wabt::Type>_>_>::
    operator++(&__end2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CWriter::MangleTagTypes(const TypeVector& types) {
  assert(types.size() >= 2);
  std::string result = "wasm_tag_";
  for (auto type : types) {
    result += MangleType(type);
  }
  return result;
}